

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c-html.c
# Opt level: O0

void render_utf8_codepoint
               (MD_HTML *r,uint codepoint,_func_void_MD_HTML_ptr_MD_CHAR_ptr_MD_SIZE *fn_append)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  code *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  size_t n;
  uchar utf8 [4];
  undefined8 local_28;
  byte local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  bVar3 = (byte)in_ESI;
  if (in_ESI < 0x80) {
    local_28 = 1;
    local_1c = bVar3;
  }
  else {
    if (in_ESI < 0x800) {
      local_28 = 2;
      local_1c = (byte)(in_ESI >> 6) & 0x1f | 0xc0;
      bVar1 = bVar3;
    }
    else {
      if (in_ESI < 0x10000) {
        local_28 = 3;
        local_1c = (byte)(in_ESI >> 0xc) & 0xf | 0xe0;
        bVar1 = (byte)(in_ESI >> 6);
        bVar2 = bVar3;
      }
      else {
        local_28 = 4;
        local_1c = (byte)(in_ESI >> 0x12) & 7 | 0xf0;
        bVar1 = (byte)(in_ESI >> 0xc);
        bVar2 = (byte)(in_ESI >> 6);
        local_19 = (bVar3 & 0x3f) + 0x80;
      }
      local_1a = (bVar2 & 0x3f) + 0x80;
    }
    local_1b = (bVar1 & 0x3f) + 0x80;
  }
  if ((in_ESI == 0) || (0x10ffff < in_ESI)) {
    (*in_RDX)(in_RDI,render_utf8_codepoint::utf8_replacement_char,3);
  }
  else {
    (*in_RDX)(in_RDI,&local_1c,local_28);
  }
  return;
}

Assistant:

static void
render_utf8_codepoint(MD_HTML* r, unsigned codepoint,
                      void (*fn_append)(MD_HTML*, const MD_CHAR*, MD_SIZE))
{
    static const MD_CHAR utf8_replacement_char[] = { (char)0xef, (char)0xbf, (char)0xbd };

    unsigned char utf8[4];
    size_t n;

    if(codepoint <= 0x7f) {
        n = 1;
        utf8[0] = codepoint;
    } else if(codepoint <= 0x7ff) {
        n = 2;
        utf8[0] = 0xc0 | ((codepoint >>  6) & 0x1f);
        utf8[1] = 0x80 + ((codepoint >>  0) & 0x3f);
    } else if(codepoint <= 0xffff) {
        n = 3;
        utf8[0] = 0xe0 | ((codepoint >> 12) & 0xf);
        utf8[1] = 0x80 + ((codepoint >>  6) & 0x3f);
        utf8[2] = 0x80 + ((codepoint >>  0) & 0x3f);
    } else {
        n = 4;
        utf8[0] = 0xf0 | ((codepoint >> 18) & 0x7);
        utf8[1] = 0x80 + ((codepoint >> 12) & 0x3f);
        utf8[2] = 0x80 + ((codepoint >>  6) & 0x3f);
        utf8[3] = 0x80 + ((codepoint >>  0) & 0x3f);
    }

    if(0 < codepoint  &&  codepoint <= 0x10ffff)
        fn_append(r, (char*)utf8, (MD_SIZE)n);
    else
        fn_append(r, utf8_replacement_char, 3);
}